

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O1

_Bool effect_handler_MOVE_ATTACK(effect_handler_context_t *context)

{
  _Bool _Var1;
  byte bVar2;
  wchar_t wVar3;
  uint uVar4;
  monster *pmVar5;
  loc_conflict lVar6;
  loc grid;
  byte unaff_BPL;
  byte bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  _Bool fear;
  loc target;
  _Bool local_49;
  loc local_48;
  wchar_t local_3c;
  ulong local_38;
  
  local_3c = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  local_48.x = (player->grid).x;
  local_48.y = (player->grid).y;
  if ((long)context->dir == 5) {
    target_get((loc_conflict *)&local_48);
  }
  else {
    local_48 = (loc)loc_sum((loc_conflict)local_48,(loc_conflict)ddgrid[context->dir]);
  }
  pmVar5 = square_monster(cave,local_48);
  if ((pmVar5 == (monster *)0x0) || (_Var1 = monster_is_obvious(pmVar5), !_Var1)) {
    unaff_BPL = 0;
    msg("This spell must target a monster.");
  }
  else {
    uVar12 = 4;
    do {
      wVar3 = distance(player->grid,(loc_conflict)local_48);
      iVar11 = (int)uVar12;
      if ((wVar3 < L'\x02') || (iVar11 < 1)) {
        iVar8 = iVar11 * local_3c + 2;
        iVar11 = iVar11 * local_3c + 5;
        if (-1 < iVar8) {
          iVar11 = iVar8;
        }
        iVar11 = (iVar11 >> 2) + 1;
        goto LAB_0013c0b5;
      }
      lVar6 = loc_diff((loc_conflict)local_48,player->grid);
      if (lVar6.x == 0) {
        iVar8 = (uint)(-1 < (long)lVar6) << 2;
      }
      else if ((ulong)lVar6 >> 0x20 == 0) {
        iVar8 = ((uint)((ulong)lVar6 >> 0x1f) & 1) * 4 + 2;
      }
      else if (lVar6.x < 0) {
        iVar8 = (lVar6.y >> 0x1f) * -2 + 5;
      }
      else {
        iVar8 = (uint)(-1 < (long)lVar6) * 2 + 1;
      }
      lVar13 = 0;
      bVar7 = 0;
      local_38 = uVar12;
      do {
        uVar9 = iVar8 + *(int *)((long)&DAT_0025f458 + lVar13) + 8;
        uVar4 = *(int *)((long)&DAT_0025f458 + lVar13) + iVar8 + 0xf;
        if (-1 < (int)uVar9) {
          uVar4 = uVar9;
        }
        iVar10 = uVar9 - (uVar4 & 0xfffffff8);
        grid = (loc)loc_sum(player->grid,(loc_conflict)clockwise_grid[iVar10]);
        _Var1 = square_ispassable(cave,grid);
        if (_Var1) {
          pmVar5 = square_monster(cave,grid);
          if (pmVar5 != (monster *)0x0) {
            bVar7 = 1;
          }
          bVar2 = 4;
          iVar8 = iVar10;
        }
        else {
          bVar2 = 0;
          if (lVar13 == 8) {
            msg("The way is barred.");
            bVar2 = 1;
            unaff_BPL = iVar11 != 4;
          }
        }
        if (bVar2 != 0) {
          uVar12 = local_38;
          if (bVar2 != 4) goto LAB_0013c066;
          break;
        }
        lVar13 = lVar13 + 4;
      } while (lVar13 != 0xc);
      move_player((int)clockwise_ddd[iVar8],false);
      unaff_BPL = (bVar7 ^ 1) & unaff_BPL;
      uVar12 = (ulong)((int)local_38 - 1);
      bVar2 = bVar7;
LAB_0013c066:
    } while (bVar2 == 0);
  }
  goto LAB_0013c080;
  while (_Var1 = py_attack_real(player,local_48,&local_49), iVar11 = iVar11 + -1, !_Var1) {
LAB_0013c0b5:
    unaff_BPL = 1;
    if (iVar11 + -1 == 0 || iVar11 < 1) break;
  }
LAB_0013c080:
  return (_Bool)(unaff_BPL & 1);
}

Assistant:

bool effect_handler_MOVE_ATTACK(effect_handler_context_t *context)
{
	int blows = effect_calculate_value(context, false);
	int moves = 4;
	int d, i;
	struct loc target = player->grid;
	struct loc next_grid, grid_diff;
	bool fear;
	struct monster *mon;

	/* Ask for a target */
	if (context->dir == DIR_TARGET) {
		target_get(&target);
	} else {
		target = loc_sum(player->grid, ddgrid[context->dir]);
	}

	mon = square_monster(cave, target);
	if (mon == NULL || !monster_is_obvious(mon)) {
		msg("This spell must target a monster.");
		return false;
	}

	while (distance(player->grid, target) > 1 && moves > 0) {
		int choice[] = { 0, 1, -1 };
		bool attack = false;
		grid_diff = loc_diff(target, player->grid);

		/* Choice of direction simplified by prioritizing diagonals */
		if (grid_diff.x == 0) {
			d = (grid_diff.y < 0) ? 0 : 4; /* up : down */
		} else if (grid_diff.y == 0) {
			d = (grid_diff.x < 0) ? 6 : 2; /* left : right */
		} else if (grid_diff.x < 0) {
			d = (grid_diff.y < 0) ? 7 : 5; /* up-left : down-left */
		} else {/* grid_diff.x > 0 */
			d = (grid_diff.y < 0) ? 1 : 3; /* up-right : down-right */
		}

		/* We'll give up to 3 choices: d, d + 1, d - 1 */
		for (i = 0; i < 3; i++) {
			int d_test = (d + choice[i] + 8) % 8;
			next_grid = loc_sum(player->grid, clockwise_grid[d_test]);
			if (square_ispassable(cave, next_grid)) {
				d = d_test;
				if (square_monster(cave, next_grid)) attack = true;
				break;
			} else if (i == 2) {
				msg("The way is barred.");
				return moves != 4;
			}
		}

		move_player(clockwise_ddd[d], false);
		moves--;
		if (attack) return false;
	}

	/* Reduce blows based on distance traveled, round to nearest blow */
	blows = (blows * moves + 2) / 4;

	/* Should return some energy if monster dies early */
	while (blows-- > 0) {
		if (py_attack_real(player, target, &fear)) break;
	}

	return true;
}